

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fastpfor.cpp
# Opt level: O3

void __thiscall
FastPForLib::FastPForTest_adHocNumbers64_Test::~FastPForTest_adHocNumbers64_Test
          (FastPForTest_adHocNumbers64_Test *this)

{
  pointer piVar1;
  pointer plVar2;
  _func_int **pp_Var3;
  GTestFlagSaver *pGVar4;
  
  this[-1].super_FastPForTest.out64.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&PTR__FastPForTest_001b67b8;
  (this->super_FastPForTest).
  super_TestWithParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super_Test._vptr_Test = (_func_int **)&PTR__FastPForTest_001b67f8;
  piVar1 = (this->super_FastPForTest).out32.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->super_FastPForTest).out64.
                                 super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_start - (long)piVar1);
  }
  plVar2 = (this->super_FastPForTest).in64.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (plVar2 != (pointer)0x0) {
    operator_delete(plVar2,(long)(this->super_FastPForTest).out32.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start - (long)plVar2);
  }
  piVar1 = (this->super_FastPForTest).in32.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->super_FastPForTest).in64.
                                 super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_start - (long)piVar1);
  }
  pp_Var3 = (this->super_FastPForTest).
            super_TestWithParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .
            super_WithParamInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._vptr_WithParamInterface;
  if (pp_Var3 != (_func_int **)0x0) {
    operator_delete(pp_Var3,(long)(this->super_FastPForTest).in32.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start - (long)pp_Var3);
  }
  pGVar4 = (this->super_FastPForTest).
           super_TestWithParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super_Test.gtest_flag_saver_._M_t.
           super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
           .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl;
  if (pGVar4 != (GTestFlagSaver *)0x0) {
    (**(code **)(*(long *)pGVar4 + 0x28))();
  }
  (this->super_FastPForTest).
  super_TestWithParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super_Test.gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)0x0;
  testing::Test::~Test
            ((Test *)&this[-1].super_FastPForTest.out64.
                      super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  return;
}

Assistant:

TEST_P(FastPForTest, adHocNumbers64) {
    int64_t data[] = {
                -3673975021604308289,
                277811506958363848,
                -7625128575524920515,
                -3321922176697690625,
                -8484521102416600502,
                4879706116117661039,
                3108316356327171753,
                -5023690236249800232};

    in64.clear();
    for (int i = 0; i < 64; ++i) {
      for (int j = 0; j < 4; ++j) {
        in64.push_back(data[j]);
      }
    }
    _verify64();
  }